

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

QName * __thiscall
Assimp::CFIReaderImpl::parseNameSurrogate(QName *__return_storage_ptr__,CFIReaderImpl *this)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  byte *pbVar4;
  size_t sVar5;
  DeadlyImportError *this_00;
  runtime_error *this_01;
  
  pbVar3 = this->dataP;
  pbVar4 = this->dataEnd;
  if ((long)pbVar4 - (long)pbVar3 < 1) {
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DeadlyImportError::DeadlyImportError(this_00,(string *)&parseErrorMessage_abi_cxx11_);
LAB_005cddfe:
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  pbVar1 = pbVar3 + 1;
  this->dataP = pbVar1;
  bVar2 = *pbVar3;
  if (3 < bVar2) {
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DeadlyImportError::DeadlyImportError(this_00,(string *)&parseErrorMessage_abi_cxx11_);
    goto LAB_005cddfe;
  }
  (__return_storage_ptr__->prefix)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->prefix).field_2;
  (__return_storage_ptr__->prefix)._M_string_length = 0;
  (__return_storage_ptr__->prefix).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->uri)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->uri).field_2;
  (__return_storage_ptr__->uri)._M_string_length = 0;
  (__return_storage_ptr__->uri).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  if (1 < bVar2) {
    if ((pbVar4 == pbVar1 || (long)pbVar4 - (long)pbVar1 < 0) || ((char)*pbVar1 < '\0')) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,(string *)&parseErrorMessage_abi_cxx11_);
      goto LAB_005cdea8;
    }
    sVar5 = parseInt2(this);
    if ((ulong)((long)(this->vocabulary).prefixTable.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->vocabulary).prefixTable.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= sVar5) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,(string *)&parseErrorMessage_abi_cxx11_);
      goto LAB_005cdea8;
    }
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  if ((bVar2 & 1) != 0) {
    if (((long)this->dataEnd - (long)this->dataP < 1) || ((char)*this->dataP < '\0')) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,(string *)&parseErrorMessage_abi_cxx11_);
      goto LAB_005cdea8;
    }
    sVar5 = parseInt2(this);
    if ((ulong)((long)(this->vocabulary).namespaceNameTable.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->vocabulary).namespaceNameTable.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= sVar5) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,(string *)&parseErrorMessage_abi_cxx11_);
      goto LAB_005cdea8;
    }
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->uri);
  }
  if (((long)this->dataEnd - (long)this->dataP < 1) || ((char)*this->dataP < '\0')) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,(string *)&parseErrorMessage_abi_cxx11_);
  }
  else {
    sVar5 = parseInt2(this);
    if (sVar5 < (ulong)((long)(this->vocabulary).localNameTable.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->vocabulary).localNameTable.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5)) {
      std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->name);
      return __return_storage_ptr__;
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,(string *)&parseErrorMessage_abi_cxx11_);
  }
LAB_005cdea8:
  *(undefined ***)this_01 = &PTR__runtime_error_007fd498;
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

QName parseNameSurrogate() { // C.16
        if (dataEnd - dataP < 1) {
            throw DeadlyImportError(parseErrorMessage);
        }
        uint8_t b = *dataP++;
        if (b & 0xfc) { // Padding '000000' C.2.5.5
            throw DeadlyImportError(parseErrorMessage);
        }
        QName result;
        size_t index;
        if (b & 0x02) { // prefix (C.16.3)
            if ((dataEnd - dataP < 1) || (*dataP & 0x80)) {
                throw DeadlyImportError(parseErrorMessage);
            }
            index = parseInt2();
            if (index >= vocabulary.prefixTable.size()) {
                throw DeadlyImportError(parseErrorMessage);
            }
            result.prefix = vocabulary.prefixTable[index];
        }
        if (b & 0x01) { // namespace-name (C.16.4)
            if ((dataEnd - dataP < 1) || (*dataP & 0x80)) {
                throw DeadlyImportError(parseErrorMessage);
            }
            index = parseInt2();
            if (index >= vocabulary.namespaceNameTable.size()) {
                throw DeadlyImportError(parseErrorMessage);
            }
            result.uri = vocabulary.namespaceNameTable[index];
        }
        // local-name
        if ((dataEnd - dataP < 1) || (*dataP & 0x80)) {
            throw DeadlyImportError(parseErrorMessage);
        }
        index = parseInt2();
        if (index >= vocabulary.localNameTable.size()) {
            throw DeadlyImportError(parseErrorMessage);
        }
        result.name = vocabulary.localNameTable[index];
        return result;
    }